

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.hpp
# Opt level: O2

void luaNewLib<6ul>(lua_State *L,luaL_Reg (*funcs) [6])

{
  lua_createtable(L,0,5);
  luaL_register(L,0,funcs);
  return;
}

Assistant:

void luaNewLib(lua_State *L, const luaL_Reg (&funcs)[N]) {
#if LUA_VERSION_NUM >= 502
	luaL_newlib(L, funcs);
#else
	lua_createtable(L, 0, N - 1);
	luaL_register(L, nullptr, funcs);
#endif
}